

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_valddi.cpp
# Opt level: O3

ze_result_t
validation_layer::zesDeviceProcessesGetState
          (zes_device_handle_t hDevice,uint32_t *pCount,zes_process_state_t *pProcesses)

{
  code *pcVar1;
  long lVar2;
  long *plVar3;
  ze_result_t result;
  ze_result_t zVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long *local_68 [2];
  long local_58 [2];
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  lVar6 = *(long *)(context + 0xd50);
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_68,"zesDeviceProcessesGetState(hDevice, pCount, pProcesses)","");
  if (*(char *)(lVar6 + 1) == '\x01') {
    local_48 = 0;
    uStack_40 = 0;
    local_38 = 0;
    spdlog::logger::log(*(logger **)(lVar6 + 8),0.0);
  }
  if (local_68[0] != local_58) {
    operator_delete(local_68[0],local_58[0] + 1);
  }
  pcVar1 = *(code **)(context + 0x8a8);
  if (pcVar1 == (code *)0x0) {
    result = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
  }
  else {
    lVar6 = *(long *)(context + 0xd30);
    lVar2 = *(long *)(context + 0xd38);
    lVar7 = lVar2 - lVar6 >> 3;
    if (lVar2 != lVar6) {
      lVar5 = 0;
      do {
        plVar3 = *(long **)(*(long *)(*(long *)(context + 0xd30) + lVar5 * 8) + 8);
        result = (**(code **)(*plVar3 + 0x90))(plVar3,hDevice,pCount,pProcesses);
        if (result != ZE_RESULT_SUCCESS) goto LAB_0017570e;
        lVar5 = lVar5 + 1;
      } while (lVar7 + (ulong)(lVar7 == 0) != lVar5);
    }
    lVar5 = context;
    if (((*(char *)(context + 4) != '\x01') ||
        (result = ZESHandleLifetimeValidation::zesDeviceProcessesGetStatePrologue
                            ((ZESHandleLifetimeValidation *)(*(long *)(context + 0xd48) + 8),hDevice
                             ,pCount,pProcesses), result == ZE_RESULT_SUCCESS)) &&
       (zVar4 = (*pcVar1)(hDevice,pCount,pProcesses), result = zVar4, lVar2 != lVar6)) {
      lVar6 = 0;
      do {
        plVar3 = *(long **)(*(long *)(*(long *)(lVar5 + 0xd30) + lVar6 * 8) + 8);
        result = (**(code **)(*plVar3 + 0x98))(plVar3,hDevice,pCount,pProcesses,zVar4);
        if (result != ZE_RESULT_SUCCESS) break;
        lVar6 = lVar6 + 1;
        result = zVar4;
      } while (lVar7 + (ulong)(lVar7 == 0) != lVar6);
    }
  }
LAB_0017570e:
  logAndPropagateResult("zesDeviceProcessesGetState",result);
  return result;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesDeviceProcessesGetState(
        zes_device_handle_t hDevice,                    ///< [in] Sysman handle for the device
        uint32_t* pCount,                               ///< [in,out] pointer to the number of processes.
                                                        ///< if count is zero, then the driver shall update the value with the
                                                        ///< total number of processes currently attached to the device.
                                                        ///< if count is greater than the number of processes currently attached to
                                                        ///< the device, then the driver shall update the value with the correct
                                                        ///< number of processes.
        zes_process_state_t* pProcesses                 ///< [in,out][optional][range(0, *pCount)] array of process information.
                                                        ///< if count is less than the number of processes currently attached to
                                                        ///< the device, then the driver shall only retrieve information about that
                                                        ///< number of processes. In this case, the return code will ::ZE_RESULT_ERROR_INVALID_SIZE.
        )
    {
        context.logger->log_trace("zesDeviceProcessesGetState(hDevice, pCount, pProcesses)");

        auto pfnProcessesGetState = context.zesDdiTable.Device.pfnProcessesGetState;

        if( nullptr == pfnProcessesGetState )
            return logAndPropagateResult("zesDeviceProcessesGetState", ZE_RESULT_ERROR_UNSUPPORTED_FEATURE);

        auto numValHandlers = context.validationHandlers.size();
        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zesValidation->zesDeviceProcessesGetStatePrologue( hDevice, pCount, pProcesses );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zesDeviceProcessesGetState", result);
        }


        if( context.enableThreadingValidation ){ 
            //Unimplemented
        }

        
        if(context.enableHandleLifetime ){
            auto result = context.handleLifetime->zesHandleLifetime.zesDeviceProcessesGetStatePrologue( hDevice, pCount, pProcesses );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zesDeviceProcessesGetState", result);
        }

        auto driver_result = pfnProcessesGetState( hDevice, pCount, pProcesses );

        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zesValidation->zesDeviceProcessesGetStateEpilogue( hDevice, pCount, pProcesses ,driver_result);
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zesDeviceProcessesGetState", result);
        }

        return logAndPropagateResult("zesDeviceProcessesGetState", driver_result);
    }